

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::correctDual(HModel *this,int *freeInfeasCount)

{
  double dVar1;
  double dVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  int *in_RSI;
  long in_RDI;
  double dVar6;
  double dVar7;
  double shift_1;
  double dual_1;
  double shift;
  double dual;
  int i;
  int workCount;
  double inf;
  double tau_d;
  double in_stack_ffffffffffffff98;
  HModel *in_stack_ffffffffffffffa0;
  int local_28;
  int local_24;
  
  dVar1 = *(double *)(in_RDI + 0x30);
  local_24 = 0;
  local_28 = 0;
  do {
    if (*(int *)(in_RDI + 0x614) <= local_28) {
      *in_RSI = local_24;
      return;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)local_28);
    if (*pvVar4 != 0) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)local_28
                         );
      if ((*pvVar5 == -1e+200) && (!NAN(*pvVar5))) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                            (long)local_28);
        if ((*pvVar5 == 1e+200) && (!NAN(*pvVar5))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),
                              (long)local_28);
          local_24 = (uint)(dVar1 <= ABS(*pvVar5)) + local_24;
          goto LAB_0017f849;
        }
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)local_28);
      iVar3 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),(long)local_28
                         );
      if ((double)iVar3 * *pvVar5 <= -dVar1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),
                            (long)local_28);
        if ((*pvVar5 != -1e+200) || (NAN(*pvVar5))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                              (long)local_28);
          if ((*pvVar5 != 1e+200) || (NAN(*pvVar5))) {
            flipBound(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
            goto LAB_0017f849;
          }
        }
        *(undefined4 *)(in_RDI + 0x570) = 1;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)local_28);
        if (*pvVar4 == 1) {
          dVar6 = HRandom::dblRandom((HRandom *)(in_RDI + 0x70));
          in_stack_ffffffffffffff98 = (dVar6 + 1.0) * dVar1;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),
                              (long)local_28);
          dVar6 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),
                              (long)local_28);
          *pvVar5 = in_stack_ffffffffffffff98;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),
                              (long)local_28);
          in_stack_ffffffffffffffa0 = (HModel *)(*pvVar5 + (in_stack_ffffffffffffff98 - dVar6));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),
                              (long)local_28);
          *pvVar5 = (value_type)in_stack_ffffffffffffffa0;
        }
        else {
          dVar6 = HRandom::dblRandom((HRandom *)(in_RDI + 0x70));
          dVar7 = -(dVar6 + 1.0) * dVar1;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),
                              (long)local_28);
          dVar6 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),
                              (long)local_28);
          *pvVar5 = dVar7;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),
                              (long)local_28);
          dVar2 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),
                              (long)local_28);
          *pvVar5 = dVar2 + (dVar7 - dVar6);
        }
      }
    }
LAB_0017f849:
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void HModel::correctDual(int *freeInfeasCount) {
  const double tau_d = dblOption[DBLOPT_DUAL_TOL];
  const double inf = HSOL_CONST_INF;
  int workCount = 0;
  for (int i = 0; i < numTot; i++) {
    if (nonbasicFlag[i]) {
      if (workLower[i] == -inf && workUpper[i] == inf) {
	// FREE variable
	workCount += (fabs(workDual[i]) >= tau_d);
      } else if (nonbasicMove[i] * workDual[i] <= -tau_d) {
	if (workLower[i] != -inf && workUpper[i] != inf) {
	  // Boxed variable = flip
	  flipBound(i);
	} else {
	  // Other variable = shift
	  problemPerturbed = 1;
	  if (nonbasicMove[i] == 1) {
	    double dual = (1 + random.dblRandom()) * tau_d;
	    double shift = dual - workDual[i];
	    workDual[i] = dual;
	    workCost[i] = workCost[i] + shift;
	  } else {
	    double dual = -(1 + random.dblRandom()) * tau_d;
	    double shift = dual - workDual[i];
	    workDual[i] = dual;
	    workCost[i] = workCost[i] + shift;
	  }
	}
      }
    }
  }
  
  *freeInfeasCount = workCount;
}